

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  _Bool _Var1;
  CURLcode CVar2;
  size_t local_68;
  char local_5d [4];
  byte local_59;
  undefined1 local_58 [3];
  char encoded [4];
  uchar in;
  dynbuf d;
  size_t sStack_30;
  CURLcode result;
  size_t length;
  byte *pbStack_20;
  int inlength_local;
  char *string_local;
  Curl_easy *data_local;
  
  if (inlength < 0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    Curl_dyn_init((dynbuf *)local_58,8000000);
    if (inlength == 0) {
      local_68 = strlen(string);
    }
    else {
      local_68 = (size_t)inlength;
    }
    sStack_30 = local_68;
    pbStack_20 = (byte *)string;
    if (local_68 == 0) {
      data_local = (Curl_easy *)(*Curl_cstrdup)("");
    }
    else {
      while (sStack_30 != 0) {
        local_59 = *pbStack_20;
        _Var1 = Curl_isunreserved(local_59);
        if (_Var1) {
          CVar2 = Curl_dyn_addn((dynbuf *)local_58,&local_59,1);
          if (CVar2 != CURLE_OK) {
            return (char *)0x0;
          }
        }
        else {
          curl_msnprintf(local_5d,4,"%%%02X",(ulong)local_59);
          CVar2 = Curl_dyn_add((dynbuf *)local_58,local_5d);
          if (CVar2 != CURLE_OK) {
            return (char *)0x0;
          }
        }
        pbStack_20 = pbStack_20 + 1;
        sStack_30 = sStack_30 - 1;
      }
      data_local = (Curl_easy *)Curl_dyn_ptr((dynbuf *)local_58);
    }
  }
  return (char *)data_local;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t length;
  CURLcode result;
  struct dynbuf d;

  if(inlength < 0)
    return NULL;

  Curl_dyn_init(&d, CURL_MAX_INPUT_LENGTH);

  length = (inlength?(size_t)inlength:strlen(string));
  if(!length)
    return strdup("");

  while(length--) {
    unsigned char in = *string; /* we need to treat the characters unsigned */

    if(Curl_isunreserved(in)) {
      /* append this */
      if(Curl_dyn_addn(&d, &in, 1))
        return NULL;
    }
    else {
      /* encode it */
      char encoded[4];
      result = Curl_convert_to_network(data, (char *)&in, 1);
      if(result) {
        /* Curl_convert_to_network calls failf if unsuccessful */
        Curl_dyn_free(&d);
        return NULL;
      }

      msnprintf(encoded, sizeof(encoded), "%%%02X", in);
      if(Curl_dyn_add(&d, encoded))
        return NULL;
    }
    string++;
  }

  return Curl_dyn_ptr(&d);
}